

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

char FIX::IntTConvertor<signed_char>::convert(string *value)

{
  const_iterator str;
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  FieldConvertError *this;
  char result;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL) & 0xffffffffffffff;
  str._M_current = (value->_M_dataplus)._M_p;
  bVar1 = convert(str,(const_iterator)(str._M_current + value->_M_string_length),
                  (char *)((long)&uStack_18 + 7));
  if (bVar1) {
    return uStack_18._7_1_;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    T result = 0;
    if (!convert(value.begin(), value.end(), result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }